

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  bool value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_also_run_disabled_tests;
  bVar1 = ParseFlag(arg,"also_run_disabled_tests",(bool *)&local_30);
  if (bVar1) {
    FLAGS_gtest_also_run_disabled_tests = local_30._M_dataplus._M_p._0_1_;
  }
  else {
    local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_break_on_failure;
    bVar1 = ParseFlag(arg,"break_on_failure",(bool *)&local_30);
    if (bVar1) {
      FLAGS_gtest_break_on_failure = local_30._M_dataplus._M_p._0_1_;
    }
    else {
      local_30._M_dataplus._M_p._0_4_ =
           CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_catch_exceptions);
      bVar1 = ParseFlag(arg,"catch_exceptions",(bool *)&local_30);
      if (bVar1) {
        FLAGS_gtest_catch_exceptions = local_30._M_dataplus._M_p._0_1_;
      }
      else {
        std::__cxx11::string::string((string *)&local_30,(string *)FLAGS_gtest_color_abi_cxx11_);
        bVar1 = ParseFlag<std::__cxx11::string>(arg,"color",&local_30);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)FLAGS_gtest_color_abi_cxx11_);
        }
        else {
          std::__cxx11::string::~string((string *)&local_30);
          std::__cxx11::string::string
                    ((string *)&local_30,(string *)FLAGS_gtest_death_test_style_abi_cxx11_);
          bVar1 = ParseFlag<std::__cxx11::string>(arg,"death_test_style",&local_30);
          if (bVar1) {
            std::__cxx11::string::_M_assign((string *)FLAGS_gtest_death_test_style_abi_cxx11_);
          }
          else {
            std::__cxx11::string::~string((string *)&local_30);
            local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_death_test_use_fork;
            bVar1 = ParseFlag(arg,"death_test_use_fork",(bool *)&local_30);
            if (bVar1) {
              FLAGS_gtest_death_test_use_fork = local_30._M_dataplus._M_p._0_1_;
              return true;
            }
            local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_fail_fast;
            bVar1 = ParseFlag(arg,"fail_fast",(bool *)&local_30);
            if (bVar1) {
              FLAGS_gtest_fail_fast = local_30._M_dataplus._M_p._0_1_;
              return true;
            }
            local_30._M_dataplus._M_p._0_4_ =
                 CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_fail_if_no_test_linked);
            bVar1 = ParseFlag(arg,"fail_if_no_test_linked",(bool *)&local_30);
            if (bVar1) {
              FLAGS_gtest_fail_if_no_test_linked = local_30._M_dataplus._M_p._0_1_;
              return true;
            }
            std::__cxx11::string::string
                      ((string *)&local_30,(string *)FLAGS_gtest_filter_abi_cxx11_);
            bVar1 = ParseFlag<std::__cxx11::string>(arg,"filter",&local_30);
            if (bVar1) {
              std::__cxx11::string::_M_assign((string *)FLAGS_gtest_filter_abi_cxx11_);
            }
            else {
              std::__cxx11::string::~string((string *)&local_30);
              std::__cxx11::string::string
                        ((string *)&local_30,
                         (string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_);
              bVar1 = ParseFlag<std::__cxx11::string>(arg,"internal_run_death_test",&local_30);
              if (bVar1) {
                std::__cxx11::string::_M_assign
                          ((string *)FLAGS_gtest_internal_run_death_test_abi_cxx11_);
              }
              else {
                std::__cxx11::string::~string((string *)&local_30);
                local_30._M_dataplus._M_p._0_4_ =
                     CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_list_tests);
                bVar1 = ParseFlag(arg,"list_tests",(bool *)&local_30);
                if (bVar1) {
                  FLAGS_gtest_list_tests = local_30._M_dataplus._M_p._0_1_;
                  return true;
                }
                std::__cxx11::string::string
                          ((string *)&local_30,(string *)FLAGS_gtest_output_abi_cxx11_);
                bVar1 = ParseFlag<std::__cxx11::string>(arg,"output",&local_30);
                if (bVar1) {
                  std::__cxx11::string::_M_assign((string *)FLAGS_gtest_output_abi_cxx11_);
                }
                else {
                  std::__cxx11::string::~string((string *)&local_30);
                  local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_brief;
                  bVar1 = ParseFlag(arg,"brief",(bool *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_brief = local_30._M_dataplus._M_p._0_1_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_print_time;
                  bVar1 = ParseFlag(arg,"print_time",(bool *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_print_time = local_30._M_dataplus._M_p._0_1_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_4_ =
                       CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_print_utf8);
                  bVar1 = ParseFlag(arg,"print_utf8",(bool *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_print_utf8 = local_30._M_dataplus._M_p._0_1_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_4_ = FLAGS_gtest_random_seed;
                  bVar1 = ParseFlag(arg,"random_seed",(int32_t *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_random_seed = local_30._M_dataplus._M_p._0_4_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_4_ = FLAGS_gtest_repeat;
                  bVar1 = ParseFlag(arg,"repeat",(int32_t *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_repeat = local_30._M_dataplus._M_p._0_4_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_1_ = FLAGS_gtest_recreate_environments_when_repeating
                  ;
                  bVar1 = ParseFlag(arg,"recreate_environments_when_repeating",(bool *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_recreate_environments_when_repeating =
                         local_30._M_dataplus._M_p._0_1_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_4_ =
                       CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_shuffle);
                  bVar1 = ParseFlag(arg,"shuffle",(bool *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_shuffle = local_30._M_dataplus._M_p._0_1_;
                    return true;
                  }
                  local_30._M_dataplus._M_p._0_4_ = FLAGS_gtest_stack_trace_depth;
                  bVar1 = ParseFlag(arg,"stack_trace_depth",(int32_t *)&local_30);
                  if (bVar1) {
                    FLAGS_gtest_stack_trace_depth = local_30._M_dataplus._M_p._0_4_;
                    return true;
                  }
                  std::__cxx11::string::string
                            ((string *)&local_30,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
                  bVar1 = ParseFlag<std::__cxx11::string>(arg,"stream_result_to",&local_30);
                  if (!bVar1) {
                    std::__cxx11::string::~string((string *)&local_30);
                    local_30._M_dataplus._M_p._0_4_ =
                         CONCAT31(local_30._M_dataplus._M_p._1_3_,FLAGS_gtest_throw_on_failure);
                    bVar1 = ParseFlag(arg,"throw_on_failure",(bool *)&local_30);
                    if (bVar1) {
                      FLAGS_gtest_throw_on_failure = local_30._M_dataplus._M_p._0_1_;
                      return bVar1;
                    }
                    return bVar1;
                  }
                  std::__cxx11::string::_M_assign((string *)FLAGS_gtest_stream_result_to_abi_cxx11_)
                  ;
                }
              }
            }
          }
        }
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return true;
}

Assistant:

static bool ParseGoogleTestFlag(const char* const arg) {
#define GTEST_INTERNAL_PARSE_FLAG(flag_name)  \
  do {                                        \
    auto value = GTEST_FLAG_GET(flag_name);   \
    if (ParseFlag(arg, #flag_name, &value)) { \
      GTEST_FLAG_SET(flag_name, value);       \
      return true;                            \
    }                                         \
  } while (false)

  GTEST_INTERNAL_PARSE_FLAG(also_run_disabled_tests);
  GTEST_INTERNAL_PARSE_FLAG(break_on_failure);
  GTEST_INTERNAL_PARSE_FLAG(catch_exceptions);
  GTEST_INTERNAL_PARSE_FLAG(color);
  GTEST_INTERNAL_PARSE_FLAG(death_test_style);
  GTEST_INTERNAL_PARSE_FLAG(death_test_use_fork);
  GTEST_INTERNAL_PARSE_FLAG(fail_fast);
  GTEST_INTERNAL_PARSE_FLAG(fail_if_no_test_linked);
  GTEST_INTERNAL_PARSE_FLAG(filter);
  GTEST_INTERNAL_PARSE_FLAG(internal_run_death_test);
  GTEST_INTERNAL_PARSE_FLAG(list_tests);
  GTEST_INTERNAL_PARSE_FLAG(output);
  GTEST_INTERNAL_PARSE_FLAG(brief);
  GTEST_INTERNAL_PARSE_FLAG(print_time);
  GTEST_INTERNAL_PARSE_FLAG(print_utf8);
  GTEST_INTERNAL_PARSE_FLAG(random_seed);
  GTEST_INTERNAL_PARSE_FLAG(repeat);
  GTEST_INTERNAL_PARSE_FLAG(recreate_environments_when_repeating);
  GTEST_INTERNAL_PARSE_FLAG(shuffle);
  GTEST_INTERNAL_PARSE_FLAG(stack_trace_depth);
  GTEST_INTERNAL_PARSE_FLAG(stream_result_to);
  GTEST_INTERNAL_PARSE_FLAG(throw_on_failure);
  return false;
}